

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

size_t __thiscall jrtplib::RTCPSDESPacket::GetItemLength(RTCPSDESPacket *this)

{
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk[this->itemoffset] == '\0') {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else {
    this_local = (RTCPSDESPacket *)(ulong)(this->currentchunk + this->itemoffset)[1];
  }
  return (size_t)this_local;
}

Assistant:

inline size_t RTCPSDESPacket::GetItemLength() const
{
	if (!knownformat)
		return None;
	if (currentchunk == 0)
		return None;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return 0;
	return (size_t)(sdeshdr->length);
}